

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

void __thiscall testing::internal::MutexBase::AssertHeld(MutexBase *this)

{
  pthread_t __thread1;
  int iVar1;
  pthread_t __thread2;
  GTestLog local_14;
  
  if (this->has_owner_ == true) {
    __thread1 = this->owner_;
    __thread2 = pthread_self();
    iVar1 = pthread_equal(__thread1,__thread2);
    if (iVar1 != 0) {
      return;
    }
  }
  GTestLog::GTestLog(&local_14,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest/gtest.h"
                     ,0x9a1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Condition has_owner_ && pthread_equal(owner_, pthread_self()) failed. ",0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"The current thread is not holding the mutex @",0x2d);
  std::ostream::_M_insert<void_const*>(&std::cerr);
  GTestLog::~GTestLog(&local_14);
  return;
}

Assistant:

void AssertHeld() const {
    GTEST_CHECK_(has_owner_ && pthread_equal(owner_, pthread_self()))
        << "The current thread is not holding the mutex @" << this;
  }